

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O3

t_int * cos_perform(t_int *w)

{
  float fVar1;
  float *pfVar2;
  t_int tVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  double dVar7;
  float *pfVar8;
  long lVar9;
  double dVar10;
  
  pfVar4 = cos_table;
  pfVar2 = (float *)w[1];
  pfVar5 = (float *)w[2];
  tVar3 = w[3];
  dVar10 = (double)(*pfVar2 * 512.0) + 1572864.0;
  dVar7 = (double)((ulong)dVar10 & 0xffffffff | 0x4138000000000000);
  pfVar8 = cos_table + ((uint)((ulong)dVar10 >> 0x20) & 0x1ff);
  if ((int)tVar3 != 1) {
    lVar6 = 0;
    lVar9 = 0;
    do {
      fVar1 = pfVar2[lVar9 + 1];
      pfVar5[lVar9] = (pfVar8[1] - *pfVar8) * (float)(dVar7 + -1572864.0) + *pfVar8;
      dVar10 = (double)(fVar1 * 512.0) + 1572864.0;
      dVar7 = (double)((ulong)dVar10 & 0xffffffff | 0x4138000000000000);
      pfVar8 = pfVar4 + ((uint)((ulong)dVar10 >> 0x20) & 0x1ff);
      lVar9 = lVar9 + 1;
      lVar6 = lVar6 + -4;
    } while ((int)tVar3 + -1 != (int)lVar9);
    pfVar5 = (float *)((long)pfVar5 - lVar6);
  }
  *pfVar5 = (pfVar8[1] - *pfVar8) * (float)(dVar7 + -1572864.0) + *pfVar8;
  return w + 4;
}

Assistant:

static t_int *cos_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    float *tab = cos_table, *addr;
    t_float f1, f2, frac;
    double dphase;
    int normhipart;
    union tabfudge tf;

    tf.tf_d = UNITBIT32;
    normhipart = tf.tf_i[HIOFFSET];

#if 0           /* this is the readable version of the code. */
    while (n--)
    {
        dphase = (double)(*in++ * (float)(COSTABSIZE)) + UNITBIT32;
        tf.tf_d = dphase;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
        f1 = addr[0];
        f2 = addr[1];
        *out++ = f1 + frac * (f2 - f1);
    }
#endif
#if 1           /* this is the same, unwrapped by hand. */
        dphase = (double)(*in++ * (float)(COSTABSIZE)) + UNITBIT32;
        tf.tf_d = dphase;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
    while (--n)
    {
        dphase = (double)(*in++ * (float)(COSTABSIZE)) + UNITBIT32;
            frac = tf.tf_d - UNITBIT32;
        tf.tf_d = dphase;
            f1 = addr[0];
            f2 = addr[1];
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
            *out++ = f1 + frac * (f2 - f1);
        tf.tf_i[HIOFFSET] = normhipart;
    }
            frac = tf.tf_d - UNITBIT32;
            f1 = addr[0];
            f2 = addr[1];
            *out++ = f1 + frac * (f2 - f1);
#endif
    return (w+4);
}